

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O2

void __thiscall wabt::ObjdumpNames::Set(ObjdumpNames *this,Index index,string_view name)

{
  mapped_type *this_00;
  allocator<char> local_4d;
  Index local_4c;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  string local_38 [32];
  
  local_48._M_str = name._M_str;
  local_48._M_len = name._M_len;
  local_4c = index;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (local_38,&local_48,&local_4d);
  this_00 = std::
            map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&this->names,&local_4c);
  std::__cxx11::string::operator=((string *)this_00,local_38);
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void ObjdumpNames::Set(Index index, std::string_view name) {
  names[index] = std::string(name);
}